

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O1

void __thiscall CcsTest_Coercion_Test::TestBody(CcsTest_Coercion_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  CcsDomain ccs;
  CcsContext ctx;
  string local_138;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  AssertHelper local_f8 [2];
  undefined1 local_e8 [24];
  CcsContext local_d0;
  undefined1 local_c0 [16];
  string local_b0;
  undefined1 local_90 [32];
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50 [2];
  RuleBuilder local_40;
  
  ::ccs::CcsDomain::CcsDomain((CcsDomain *)(local_e8 + 0x10),false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)local_90);
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"int","");
  local_d0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"123","");
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_90 + 0x10),(string *)local_90,&local_138);
  local_118 = (undefined1  [8])&local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"double","");
  local_f8[0].data_ = (AssertHelperData *)local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"123.0","");
  ::ccs::RuleBuilder::set((RuleBuilder *)local_70,(string *)(local_90 + 0x10),(string *)local_118);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"bool","");
  local_60._M_allocated_capacity = (size_type)local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_70 + 0x10),"true","");
  ::ccs::RuleBuilder::set(&local_40,(string *)local_70,&local_b0);
  if (local_40.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.impl.super___shared_ptr<ccs::RuleBuilder::Impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((long *)local_60._M_allocated_capacity != local_50) {
    operator_delete((void *)local_60._M_allocated_capacity,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (local_f8[0].data_ != (AssertHelperData *)local_e8) {
    operator_delete(local_f8[0].data_,local_e8._0_8_ + 1);
  }
  if (local_118 != (undefined1  [8])&local_108) {
    operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._24_8_);
  }
  if (local_d0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)local_c0) {
    operator_delete(local_d0.searchState.
                    super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    local_c0._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  ::ccs::CcsDomain::build((CcsDomain *)&local_d0);
  local_f8[0].data_._0_4_ = 0x7b;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"int","");
  iVar3 = ::ccs::CcsContext::getInt(&local_d0,&local_138);
  local_b0._M_dataplus._M_p._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_118,"123","ctx.getInt(\"int\")",(int *)local_f8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdc,pcVar4);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_f8[0].data_ = (AssertHelperData *)0x405ec00000000000;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"int","");
  local_b0._M_dataplus._M_p = (pointer)::ccs::CcsContext::getDouble(&local_d0,&local_138);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"123.0","ctx.getDouble(\"int\")",(double *)local_f8,
             (double *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdd,pcVar4);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_f8[0].data_ = (AssertHelperData *)0x405ec00000000000;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"double","");
  local_b0._M_dataplus._M_p = (pointer)::ccs::CcsContext::getDouble(&local_d0,&local_138);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_118,"123.0","ctx.getDouble(\"double\")",(double *)local_f8,
             (double *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xde,pcVar4);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  local_f8[0].data_._0_1_ = 1;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"bool","");
  bVar2 = ::ccs::CcsContext::getBool(&local_d0,&local_138);
  local_b0._M_dataplus._M_p._0_1_ = bVar2;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_118,"true","ctx.getBool(\"bool\")",(bool *)local_f8,(bool *)&local_b0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_118[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_138);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdf,pcVar4);
    testing::internal::AssertHelper::operator=(local_f8,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_138._M_dataplus._M_p + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  if (local_d0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ::ccs::CcsDomain::~CcsDomain((CcsDomain *)(local_e8 + 0x10));
  return;
}

Assistant:

TEST(CcsTest, Coercion) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("int", "123")
      .set("double", "123.0")
      .set("bool", "true");
  CcsContext ctx = ccs.build();
  EXPECT_EQ(123, ctx.getInt("int"));
  EXPECT_EQ(123.0, ctx.getDouble("int"));
  EXPECT_EQ(123.0, ctx.getDouble("double"));
  EXPECT_EQ(true, ctx.getBool("bool"));
}